

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLoc.cpp
# Opt level: O2

void llvm::DWARFDebugLoclists::dumpRange
               (DWARFDataExtractor *Data,uint64_t StartOffset,uint64_t Size,uint16_t Version,
               raw_ostream *OS,uint64_t BaseAddr,MCRegisterInfo *MRI,DIDumpOptions DumpOpts)

{
  bool bVar1;
  char *pcVar2;
  StringRef Str;
  size_t sStackY_80;
  ulong local_38;
  uint64_t Offset;
  
  if ((StartOffset <= Size + StartOffset) &&
     ((Size + StartOffset) - 1 < (Data->super_DataExtractor).Data.Length)) {
    sStackY_80 = 0;
    pcVar2 = (char *)0x0;
    local_38 = StartOffset;
    do {
      if (Size + StartOffset <= local_38) {
        return;
      }
      Str.Length = sStackY_80;
      Str.Data = pcVar2;
      raw_ostream::operator<<(OS,Str);
      bVar1 = dumpLocationList(Data,&local_38,Version,OS,BaseAddr,MRI,(DWARFUnit *)0x0,DumpOpts,0xc)
      ;
      raw_ostream::operator<<(OS,'\n');
      sStackY_80 = 1;
      pcVar2 = "\n";
    } while (bVar1);
    return;
  }
  raw_ostream::operator<<(OS,"Invalid dump range\n");
  return;
}

Assistant:

void DWARFDebugLoclists::dumpRange(const DWARFDataExtractor &Data,
                                   uint64_t StartOffset, uint64_t Size,
                                   uint16_t Version, raw_ostream &OS,
                                   uint64_t BaseAddr, const MCRegisterInfo *MRI,
                                   DIDumpOptions DumpOpts) {
  if (!Data.isValidOffsetForDataOfSize(StartOffset, Size))  {
    OS << "Invalid dump range\n";
    return;
  }
  uint64_t Offset = StartOffset;
  StringRef Separator;
  bool CanContinue = true;
  while (CanContinue && Offset < StartOffset + Size) {
    OS << Separator;
    Separator = "\n";

    CanContinue = dumpLocationList(Data, &Offset, Version, OS, BaseAddr, MRI,
                                   nullptr, DumpOpts, /*Indent=*/12);
    OS << '\n';
  }
}